

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_destination_token(Context *ctx,DestArgInfo *info)

{
  uint32 uVar1;
  RegisterType RVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  RegisterList *pRVar7;
  uint rnum;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar1 = ctx->tokencount;
  if (uVar1 == 0) {
    failf(ctx,"%s","Out of tokens in destination parameter");
    return 0;
  }
  puVar3 = ctx->tokens;
  uVar6 = *puVar3;
  info->token = puVar3;
  rnum = uVar6 & 0x7ff;
  info->regnum = rnum;
  info->relative = uVar6 >> 0xd & 1;
  uVar10 = uVar6 >> 0x10 & 0xf;
  info->orig_writemask = uVar10;
  info->result_mod = uVar6 >> 0x14 & 0xf;
  info->result_shift = uVar6 >> 0x18 & 0xf;
  uVar9 = uVar6 >> 0x1c & 7;
  uVar11 = uVar6 >> 8 & 0x18;
  RVar2 = uVar9 + uVar11;
  info->regtype = RVar2;
  iVar4 = isscalar(ctx,ctx->shader_type,RVar2,rnum);
  uVar5 = 1;
  if (iVar4 == 0) {
    uVar5 = uVar10;
  }
  info->writemask = uVar5;
  info->writemask0 = uVar5 & 1;
  info->writemask1 = uVar5 >> 1 & 1;
  info->writemask2 = uVar5 >> 2 & 1;
  info->writemask3 = uVar5 >> 3;
  uVar5 = (uVar9 + uVar11) - 0xb;
  if (uVar5 < 3) {
    info->regtype = REG_TYPE_CONST;
    info->regnum = uVar5 * 0x800 + rnum + 0x800;
  }
  ctx->tokens = puVar3 + 1;
  ctx->tokencount = uVar1 - 1;
  ctx->current_position = ctx->current_position + 4;
  if ((uVar6 & 0xc000) != 0) {
    failf(ctx,"%s","Reserved bit #1 in destination token must be zero");
  }
  if (-1 < (int)uVar6) {
    failf(ctx,"%s","Reserved bit #2 in destination token must be one");
  }
  if (info->relative != 0) {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      failf(ctx,"%s","Relative addressing in non-vertex shader");
    }
    if (ctx->major_ver < 3) {
      failf(ctx,"%s","Relative addressing in vertex shader version < 3.0");
    }
    if (((ctx->ctab).have_ctab == 0) && (ctx->ignores_ctab == 0)) {
      failf(ctx,"%s","relative addressing unsupported without a CTAB");
    }
    failf(ctx,"%s","Relative addressing of dest tokens is unsupported");
    return 2;
  }
  uVar6 = info->result_shift;
  if (uVar6 != 0) {
    if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
      failf(ctx,"%s","Result shift scale in non-pixel shader");
    }
    if (1 < ctx->major_ver) {
      failf(ctx,"%s","Result shift scale in pixel shader version >= 2.0");
    }
    if ((0xf < uVar6) || ((0xe00eU >> (uVar6 & 0x1f) & 1) == 0)) {
      failf(ctx,"%s","Result shift scale isn\'t 1 to 3, or 13 to 15.");
    }
  }
  uVar6 = info->result_mod;
  if (((uVar6 & 2) != 0) && (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) {
    failf(ctx,"%s","Partial precision result mod in non-pixel shader");
    uVar6 = info->result_mod;
  }
  if ((uVar6 & 4) != 0) {
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
      if (ctx->centroid_allowed != 0) goto LAB_00119776;
      pcVar8 = "Centroid modifier not allowed here";
    }
    else {
      pcVar8 = "Centroid result mod in non-pixel shader";
    }
    failf(ctx,"%s",pcVar8);
  }
LAB_00119776:
  if (REG_TYPE_MAX < info->regtype) {
    failf(ctx,"%s","Register type is out of range");
  }
  if (ctx->isfail == 0) {
    iVar4 = info->regnum;
    RVar2 = info->regtype;
    if (0 < iVar4 && RVar2 == REG_TYPE_COLOROUT) {
      ctx->have_multi_color_outputs = 1;
    }
    pRVar7 = reglist_insert(ctx,&ctx->used_registers,RVar2,iVar4);
    if (pRVar7 != (RegisterList *)0x0) {
      pRVar7->written = 1;
    }
  }
  return 1;
}

Assistant:

static int parse_destination_token(Context *ctx, DestArgInfo *info)
{
    // !!! FIXME: recheck against the spec for ranges (like RASTOUT values, etc).
    if (ctx->tokencount == 0)
    {
        fail(ctx, "Out of tokens in destination parameter");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 14) & 0x3); // bits 14 through 15
    const int reserved2 = (int) ((token >> 31) & 0x1); // bit 31

    info->token = ctx->tokens;
    info->regnum = (int) (token & 0x7ff);  // bits 0 through 10
    info->relative = (int) ((token >> 13) & 0x1); // bit 13
    info->orig_writemask = (int) ((token >> 16) & 0xF); // bits 16 through 19
    info->result_mod = (int) ((token >> 20) & 0xF); // bits 20 through 23
    info->result_shift = (int) ((token >> 24) & 0xF); // bits 24 through 27      abc
    info->regtype = (RegisterType) (((token >> 28) & 0x7) | ((token >> 8) & 0x18));  // bits 28-30, 11-12

    int writemask;
    if (isscalar(ctx, ctx->shader_type, info->regtype, info->regnum))
        writemask = 0x1;  // just x.
    else
        writemask = info->orig_writemask;

    set_dstarg_writemask(info, writemask);  // bits 16 through 19.

    // all the REG_TYPE_CONSTx types are the same register type, it's just
    //  split up so its regnum can be > 2047 in the bytecode. Clean it up.
    if (info->regtype == REG_TYPE_CONST2)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 2048;
    } // else if
    else if (info->regtype == REG_TYPE_CONST3)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 4096;
    } // else if
    else if (info->regtype == REG_TYPE_CONST4)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 6144;
    } // else if

    // swallow token for now, for multiple calls in a row.
    adjust_token_position(ctx, 1);

    if (reserved1 != 0x0)
        fail(ctx, "Reserved bit #1 in destination token must be zero");

    if (reserved2 != 0x1)
        fail(ctx, "Reserved bit #2 in destination token must be one");

    if (info->relative)
    {
        if (!shader_is_vertex(ctx))
            fail(ctx, "Relative addressing in non-vertex shader");
        if (!shader_version_atleast(ctx, 3, 0))
            fail(ctx, "Relative addressing in vertex shader version < 3.0");
        if ((!ctx->ctab.have_ctab) && (!ctx->ignores_ctab))
        {
            // it's hard to do this efficiently without!
            fail(ctx, "relative addressing unsupported without a CTAB");
        } // if

        // !!! FIXME: I don't have a shader that has a relative dest currently.
        fail(ctx, "Relative addressing of dest tokens is unsupported");
        return 2;
    } // if

    const int s = info->result_shift;
    if (s != 0)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Result shift scale in non-pixel shader");
        if (shader_version_atleast(ctx, 2, 0))
            fail(ctx, "Result shift scale in pixel shader version >= 2.0");
        if ( ! (((s >= 1) && (s <= 3)) || ((s >= 0xD) && (s <= 0xF))) )
            fail(ctx, "Result shift scale isn't 1 to 3, or 13 to 15.");
    } // if

    if (info->result_mod & MOD_PP)  // Partial precision (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Partial precision result mod in non-pixel shader");
    } // if

    if (info->result_mod & MOD_CENTROID)  // Centroid (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Centroid result mod in non-pixel shader");
        else if (!ctx->centroid_allowed)  // only on DCL opcodes!
            fail(ctx, "Centroid modifier not allowed here");
    } // if

    if (/*(info->regtype < 0) ||*/ (info->regtype > REG_TYPE_MAX))
        fail(ctx, "Register type is out of range");

    if (!isfail(ctx))
        set_used_register(ctx, info->regtype, info->regnum, 1);

    return 1;
}